

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O3

LockedHandle<perfetto::TrackEvent> * __thiscall
perfetto::DataSource<perfetto::TrackEvent,_perfetto::internal::TrackEventDataSourceTraits>::
TraceContext::GetDataSourceLocked
          (LockedHandle<perfetto::TrackEvent> *__return_storage_ptr__,TraceContext *this)

{
  uint uVar1;
  TrackEvent *pTVar2;
  char *pcVar3;
  bool bVar4;
  unique_lock<std::recursive_mutex> local_48;
  unique_lock<std::recursive_mutex> local_38;
  
  uVar1 = this->instance_index_;
  bVar4 = ((uint)static_state_.valid_instances.super___atomic_base<unsigned_int>._M_i >>
           (uVar1 & 0x1f) & 1) == 0;
  if (bVar4) {
    *(undefined8 *)&(__return_storage_ptr__->lock_)._M_owns = 0;
    pcVar3 = (char *)0x0;
    pTVar2 = (TrackEvent *)0x0;
  }
  else {
    local_38._M_device = (mutex_type *)(static_state_.instances._M_elems[uVar1].storage + 0x38);
    local_38._M_owns = false;
    ::std::unique_lock<std::recursive_mutex>::lock(&local_38);
    pcVar3 = (char *)local_38._M_device;
    local_38._M_device = (mutex_type *)0x0;
    local_38._M_owns = false;
    pTVar2 = *(TrackEvent **)(static_state_.instances._M_elems[uVar1].storage + 0x60);
    local_48._M_device = (mutex_type *)0x0;
    local_48._M_owns = false;
    ::std::unique_lock<std::recursive_mutex>::~unique_lock(&local_48);
    ::std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
  }
  (__return_storage_ptr__->lock_)._M_device = (mutex_type *)pcVar3;
  (__return_storage_ptr__->lock_)._M_owns = !bVar4;
  __return_storage_ptr__->obj_ = pTVar2;
  return __return_storage_ptr__;
}

Assistant:

LockedHandle<DataSourceType> GetDataSourceLocked() const {
      auto* internal_state = static_state_.TryGet(instance_index_);
      if (!internal_state)
        return LockedHandle<DataSourceType>();
      std::unique_lock<std::recursive_mutex> lock(internal_state->lock);
      return LockedHandle<DataSourceType>(
          std::move(lock),
          static_cast<DataSourceType*>(internal_state->data_source.get()));
    }